

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license++.cpp
# Opt level: O0

void mergeLicenses(vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                   *licenses,LicenseInfo *license)

{
  iterator iVar1;
  bool bVar2;
  pointer pFVar3;
  time_t tVar4;
  __normal_iterator<license::FullLicenseInfo_*,_std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>_>
  local_30;
  __normal_iterator<license::FullLicenseInfo_*,_std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>_>
  local_28;
  iterator it;
  time_t curLicense_exp;
  LicenseInfo *license_local;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *licenses_local;
  
  if (license != (LicenseInfo *)0x0) {
    it._M_current = (FullLicenseInfo *)0x0;
    local_28._M_current =
         (FullLicenseInfo *)
         std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::begin
                   (licenses);
    while( true ) {
      local_30._M_current =
           (FullLicenseInfo *)
           std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::end
                     (licenses);
      bVar2 = __gnu_cxx::operator!=(&local_28,&local_30);
      if (!bVar2) break;
      pFVar3 = __gnu_cxx::
               __normal_iterator<license::FullLicenseInfo_*,_std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>_>
               ::operator->(&local_28);
      iVar1 = it;
      if ((pFVar3->has_expiry & 1U) == 0) {
        pFVar3 = __gnu_cxx::
                 __normal_iterator<license::FullLicenseInfo_*,_std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>_>
                 ::operator->(&local_28);
        ::license::FullLicenseInfo::toLicenseInfo(pFVar3,license);
        return;
      }
      pFVar3 = __gnu_cxx::
               __normal_iterator<license::FullLicenseInfo_*,_std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>_>
               ::operator->(&local_28);
      tVar4 = ::license::FullLicenseInfo::expires_on(pFVar3);
      if ((long)iVar1._M_current < tVar4) {
        pFVar3 = __gnu_cxx::
                 __normal_iterator<license::FullLicenseInfo_*,_std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>_>
                 ::operator->(&local_28);
        it._M_current = (FullLicenseInfo *)::license::FullLicenseInfo::expires_on(pFVar3);
        pFVar3 = __gnu_cxx::
                 __normal_iterator<license::FullLicenseInfo_*,_std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>_>
                 ::operator->(&local_28);
        ::license::FullLicenseInfo::toLicenseInfo(pFVar3,license);
      }
      __gnu_cxx::
      __normal_iterator<license::FullLicenseInfo_*,_std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>_>
      ::operator++(&local_28,0);
    }
  }
  return;
}

Assistant:

static void mergeLicenses(vector<license::FullLicenseInfo> licenses,
		LicenseInfo* license) {
	if (license != NULL) {
		time_t curLicense_exp = 0;
		for (auto it = licenses.begin(); it != licenses.end(); it++) {
			//choose the license that expires later...
			if (!it->has_expiry) {
				it->toLicenseInfo(license);
				break;
			} else if (curLicense_exp < it->expires_on()) {
				curLicense_exp = it->expires_on();
				it->toLicenseInfo(license);
			}
		}
	}
}